

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_0::imageFormatProperties
          (TestStatus *__return_storage_ptr__,Context *context,VkFormat format,VkImageType imageType
          ,VkImageTiling tiling)

{
  VkBool32 VVar1;
  TestLog *log;
  pointer pbVar2;
  ChannelOrder CVar3;
  deUint32 dVar4;
  VkSampleCountFlags VVar5;
  VkDeviceSize VVar6;
  TestStatus *pTVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  TextureChannelClass TVar12;
  qpTestResult qVar13;
  VkPhysicalDeviceFeatures *pVVar14;
  VkPhysicalDeviceProperties *pVVar15;
  InstanceInterface *pIVar16;
  VkPhysicalDevice pVVar17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar18;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var19;
  long *plVar20;
  TextureFormat TVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  uint uVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  undefined8 uVar27;
  TestLog *pTVar28;
  uint uVar29;
  ostringstream *poVar30;
  bool bVar31;
  bool bVar32;
  VkFormatProperties VVar33;
  VkImageFormatProperties properties;
  string local_2a8;
  undefined1 local_280 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270 [6];
  ios_base local_210 [8];
  ios_base local_208 [264];
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  ResultCollector results;
  Bitfield<32UL> local_98;
  TestStatus *local_78;
  ulong local_70;
  Bitfield<32UL> local_68;
  Enum<vk::VkImageTiling,_4UL> local_50;
  Enum<vk::VkImageType,_4UL> local_40;
  
  log = context->m_testCtx->m_log;
  pVVar14 = Context::getDeviceFeatures(context);
  pVVar15 = Context::getDeviceProperties(context);
  pIVar16 = Context::getInstanceInterface(context);
  pVVar17 = Context::getPhysicalDevice(context);
  VVar33 = ::vk::getPhysicalDeviceFormatProperties(pIVar16,pVVar17,format);
  pvVar18 = Context::getDeviceExtensions_abi_cxx11_(context);
  local_280._0_8_ = local_280 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"VK_KHR_maintenance1","");
  pbVar2 = (pvVar18->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  _Var19 = std::
           __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                     ((pvVar18->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,pbVar2,local_280);
  if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
    operator_delete((void *)local_280._0_8_,local_270[0]._M_allocated_capacity + 1);
  }
  uVar26 = VVar33._0_8_ >> 0x20;
  if (tiling == VK_IMAGE_TILING_LINEAR) {
    uVar26 = VVar33._0_8_;
  }
  uVar8 = (uint)((int)uVar26 != 0) * 3;
  if (_Var19._M_current != pbVar2) {
    uVar8 = (uint)(uVar26 >> 0xe) & 3;
  }
  uVar29 = (int)uVar26 * 4;
  uVar23 = uVar8 + 0xd0;
  if (-1 < (char)uVar26) {
    uVar23 = uVar8;
  }
  uVar23 = uVar23 + (uVar29 & 4);
  local_280._0_8_ = local_280 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"ERROR: ","");
  tcu::ResultCollector::ResultCollector(&results,log,(string *)local_280);
  if ((TestLog *)local_280._0_8_ != (TestLog *)(local_280 + 0x10)) {
    operator_delete((void *)local_280._0_8_,local_270[0]._M_allocated_capacity + 1);
  }
  local_78 = __return_storage_ptr__;
  if ((uVar26 & 1) != 0 && _Var19._M_current != pbVar2) {
    local_280._0_8_ = local_280 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,
               "A sampled image format must have VK_FORMAT_FEATURE_TRANSFER_SRC_BIT_KHR and VK_FORMAT_FEATURE_TRANSFER_DST_BIT_KHR format feature flags set"
               ,"");
    tcu::ResultCollector::check(&results,(uVar26 & 0xc000) != 0,(string *)local_280);
    if ((TestLog *)local_280._0_8_ != (TestLog *)(local_280 + 0x10)) {
      operator_delete((void *)local_280._0_8_,local_270[0]._M_allocated_capacity + 1);
    }
  }
  uVar8 = (uint)(uVar26 >> 4) & 0x20;
  uVar29 = uVar29 & 8;
  local_fc = ~(uVar29 + uVar8 | uVar23);
  local_100 = (uint)(imageType == VK_IMAGE_TYPE_2D) << 4 | 8;
  local_70 = (ulong)(uVar8 | uVar23 | uVar29);
  uVar8 = 0;
  do {
    if ((local_fc & uVar8) == 0) {
      if ((uVar8 & 0x40) == 0) {
        if (uVar8 != 0) {
LAB_00449765:
          local_f8 = (int)(uVar8 << 0x1d) >> 0x1f & local_100;
          if ((uVar8 & 0xc) != 0 && (char)((uVar8 & 0x40) >> 6) == '\0') {
            uVar23 = local_f8 | 3;
            if (pVVar14->sparseBinding == 0) {
              uVar23 = local_f8;
            }
            local_f8 = uVar23 | 4;
            if (pVVar14->sparseResidencyAliased == 0) {
              local_f8 = uVar23;
            }
          }
          local_f4 = ~local_f8;
          local_f8 = local_f8 + 1;
          uVar24 = 0;
          do {
            uVar23 = (uint)uVar24;
            if ((local_f4 & uVar23) == 0) {
              if (tiling == VK_IMAGE_TILING_LINEAR) {
                bVar31 = false;
              }
              else {
                bVar31 = ::vk::isCompressedFormat(format);
                if ((uVar8 < 8 || !bVar31) &&
                   (bVar31 = ::vk::isCompressedFormat(format),
                   (imageType & ~VK_IMAGE_TYPE_3D) != VK_IMAGE_TYPE_1D || !bVar31)) {
                  bVar31 = true;
                  if ((uVar24 & 2) == 0) goto LAB_0044982f;
                  bVar31 = ::vk::isCompressedFormat(format);
                  if ((!bVar31) && (bVar31 = ::vk::isDepthStencilFormat(format), !bVar31)) {
                    local_280._0_8_ = ::vk::mapVkFormat(format);
                    uVar29 = tcu::TextureFormat::getPixelSize((TextureFormat *)local_280);
                    if ((uVar29 & uVar29 - 1) == 0) {
                      if (imageType == VK_IMAGE_TYPE_3D) {
                        VVar1 = pVVar14->sparseResidencyImage3D;
                      }
                      else {
                        if (imageType != VK_IMAGE_TYPE_2D) goto LAB_00449827;
                        VVar1 = pVVar14->sparseResidencyImage2D;
                      }
                      bVar31 = VVar1 == 1;
                      goto LAB_0044982f;
                    }
                  }
                }
LAB_00449827:
                bVar31 = false;
              }
LAB_0044982f:
              poVar30 = (ostringstream *)(local_280 + 8);
              local_280._0_8_ = log;
              std::__cxx11::ostringstream::ostringstream(poVar30);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar30,"Testing ",8);
              local_40.m_getName = ::vk::getImageTypeName;
              local_40.m_value = imageType;
              tcu::Format::Enum<vk::VkImageType,_4UL>::toStream(&local_40,(ostream *)poVar30);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar30,", ",2);
              local_50.m_getName = ::vk::getImageTilingName;
              local_50.m_value = tiling;
              tcu::Format::Enum<vk::VkImageTiling,_4UL>::toStream(&local_50,(ostream *)poVar30);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar30,", ",2);
              ::vk::getImageUsageFlagsStr(&local_98,uVar8);
              local_2a8.field_2._M_allocated_capacity = (size_type)local_98.m_end;
              local_2a8._M_dataplus._M_p = (pointer)local_98.m_value;
              local_2a8._M_string_length = (size_type)local_98.m_begin;
              tcu::Format::Bitfield<32UL>::toStream((Bitfield<32UL> *)&local_2a8,(ostream *)poVar30)
              ;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar30,", ",2);
              ::vk::getImageCreateFlagsStr(&local_68,uVar23);
              local_2a8.field_2._M_allocated_capacity = (size_type)local_68.m_end;
              local_2a8._M_string_length = CONCAT44(local_68.m_begin._4_4_,(int)local_68.m_begin);
              local_2a8._M_dataplus._M_p = (pointer)local_68.m_value;
              tcu::Format::Bitfield<32UL>::toStream((Bitfield<32UL> *)&local_2a8,(ostream *)poVar30)
              ;
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar30);
              std::ios_base::~ios_base(local_208);
              properties.maxExtent.width = 0xcdcdcdcd;
              properties.maxExtent.height = 0xcdcdcdcd;
              properties.maxExtent.depth = 0xcdcdcdcd;
              properties.maxMipLevels = 0xcdcdcdcd;
              properties.maxArrayLayers = 0xcdcdcdcd;
              properties.sampleCounts = 0xcdcdcdcd;
              properties.maxResourceSize = 0xcdcdcdcdcdcdcdcd;
              pIVar16 = Context::getInstanceInterface(context);
              pVVar17 = Context::getPhysicalDevice(context);
              iVar9 = (*pIVar16->_vptr_InstanceInterface[4])
                                (pIVar16,pVVar17,(ulong)format,(ulong)imageType,(ulong)tiling,
                                 (ulong)uVar8,uVar24,&properties);
              if (iVar9 == -0xb) {
                poVar30 = (ostringstream *)(local_280 + 8);
                local_280._0_8_ = log;
                std::__cxx11::ostringstream::ostringstream(poVar30);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30,"Got VK_ERROR_FORMAT_NOT_SUPPORTED",0x21);
                pTVar28 = (TestLog *)(local_280 + 0x10);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream(poVar30);
                std::ios_base::~ios_base(local_208);
                if (bVar31) {
                  local_280._0_8_ = pTVar28;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_280,
                             "VK_ERROR_FORMAT_NOT_SUPPORTED returned for required image parameter combination"
                             ,"");
                  tcu::ResultCollector::fail(&results,(string *)local_280);
                  if ((TestLog *)local_280._0_8_ != pTVar28) {
                    operator_delete((void *)local_280._0_8_,local_270[0]._M_allocated_capacity + 1);
                  }
                }
                dVar4 = properties.maxExtent.width;
                local_280._0_8_ = pTVar28;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_280,"maxExtent.width != 0","");
                tcu::ResultCollector::check(&results,dVar4 == 0,(string *)local_280);
                if ((TestLog *)local_280._0_8_ != pTVar28) {
                  operator_delete((void *)local_280._0_8_,local_270[0]._M_allocated_capacity + 1);
                }
                dVar4 = properties.maxExtent.height;
                local_280._0_8_ = pTVar28;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_280,"maxExtent.height != 0","");
                tcu::ResultCollector::check(&results,dVar4 == 0,(string *)local_280);
                if ((TestLog *)local_280._0_8_ != pTVar28) {
                  operator_delete((void *)local_280._0_8_,local_270[0]._M_allocated_capacity + 1);
                }
                dVar4 = properties.maxExtent.depth;
                local_280._0_8_ = pTVar28;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_280,"maxExtent.depth != 0","");
                tcu::ResultCollector::check(&results,dVar4 == 0,(string *)local_280);
                if ((TestLog *)local_280._0_8_ != pTVar28) {
                  operator_delete((void *)local_280._0_8_,local_270[0]._M_allocated_capacity + 1);
                }
                dVar4 = properties.maxMipLevels;
                local_280._0_8_ = pTVar28;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_280,"maxMipLevels != 0","");
                tcu::ResultCollector::check(&results,dVar4 == 0,(string *)local_280);
                if ((TestLog *)local_280._0_8_ != pTVar28) {
                  operator_delete((void *)local_280._0_8_,local_270[0]._M_allocated_capacity + 1);
                }
                dVar4 = properties.maxArrayLayers;
                local_280._0_8_ = pTVar28;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_280,"maxArrayLayers != 0","");
                tcu::ResultCollector::check(&results,dVar4 == 0,(string *)local_280);
                if ((TestLog *)local_280._0_8_ != pTVar28) {
                  operator_delete((void *)local_280._0_8_,local_270[0]._M_allocated_capacity + 1);
                }
                VVar5 = properties.sampleCounts;
                local_280._0_8_ = pTVar28;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_280,"sampleCounts != 0","");
                tcu::ResultCollector::check(&results,VVar5 == 0,(string *)local_280);
                if ((TestLog *)local_280._0_8_ != pTVar28) {
                  operator_delete((void *)local_280._0_8_,local_270[0]._M_allocated_capacity + 1);
                }
                VVar6 = properties.maxResourceSize;
                local_280._0_8_ = pTVar28;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_280,"maxResourceSize != 0","");
                tcu::ResultCollector::check(&results,VVar6 == 0,(string *)local_280);
LAB_0044a71e:
                uVar27 = local_270[0]._M_allocated_capacity;
                pTVar28 = (TestLog *)local_280._0_8_;
                if ((TestLog *)local_280._0_8_ == (TestLog *)(local_280 + 0x10)) goto LAB_0044a73f;
              }
              else {
                if (iVar9 == 0) {
                  uVar10 = 0x20;
                  uVar29 = 0x20;
                  if (properties.maxExtent.width != 0) {
                    uVar29 = 0x1f;
                    if (properties.maxExtent.width != 0) {
                      for (; properties.maxExtent.width >> uVar29 == 0; uVar29 = uVar29 - 1) {
                      }
                    }
                    uVar29 = uVar29 ^ 0x1f;
                  }
                  if (properties.maxExtent.height != 0) {
                    uVar10 = 0x1f;
                    if (properties.maxExtent.height != 0) {
                      for (; properties.maxExtent.height >> uVar10 == 0; uVar10 = uVar10 - 1) {
                      }
                    }
                    uVar10 = uVar10 ^ 0x1f;
                  }
                  iVar25 = 0x1f - ((uVar29 - 1) +
                                  (uint)((properties.maxExtent.width - 1 &
                                         properties.maxExtent.width) == 0));
                  iVar9 = 0x1f - ((uVar10 - 1) +
                                 (uint)((properties.maxExtent.height - 1 &
                                        properties.maxExtent.height) == 0));
                  if (iVar9 < iVar25) {
                    iVar9 = iVar25;
                  }
                  if (properties.maxExtent.depth == 0) {
                    uVar29 = 0x20;
                  }
                  else {
                    uVar29 = 0x1f;
                    if (properties.maxExtent.depth != 0) {
                      for (; properties.maxExtent.depth >> uVar29 == 0; uVar29 = uVar29 - 1) {
                      }
                    }
                    uVar29 = uVar29 ^ 0x1f;
                  }
                  iVar25 = 0x1f - ((uVar29 - 1) +
                                  (uint)((properties.maxExtent.depth - 1 &
                                         properties.maxExtent.depth) == 0));
                  if (iVar25 < iVar9) {
                    iVar25 = iVar9;
                  }
                  poVar30 = (ostringstream *)(local_280 + 8);
                  local_280._0_8_ = log;
                  std::__cxx11::ostringstream::ostringstream(poVar30);
                  ::vk::operator<<((ostream *)poVar30,&properties);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar30,"\n",1);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_280,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream(poVar30);
                  std::ios_base::~ios_base(local_208);
                  bVar32 = true;
                  if (imageType == VK_IMAGE_TYPE_1D) {
                    bVar32 = false;
                    if ((properties.maxExtent.width != 0) &&
                       (bVar32 = false, properties.maxExtent.height == 1)) {
                      bVar32 = properties.maxExtent.depth == 1;
                    }
                  }
                  local_280._0_8_ = local_280 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_280,"Invalid dimensions for 1D image","");
                  tcu::ResultCollector::check(&results,bVar32,(string *)local_280);
                  if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
                    operator_delete((void *)local_280._0_8_,local_270[0]._M_allocated_capacity + 1);
                  }
                  bVar32 = true;
                  if (imageType == VK_IMAGE_TYPE_2D) {
                    bVar32 = false;
                    if ((properties.maxExtent.width != 0) &&
                       (bVar32 = false, properties.maxExtent.height != 0)) {
                      bVar32 = properties.maxExtent.depth == 1;
                    }
                  }
                  local_280._0_8_ = local_280 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_280,"Invalid dimensions for 2D image","");
                  tcu::ResultCollector::check(&results,bVar32,(string *)local_280);
                  if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
                    operator_delete((void *)local_280._0_8_,local_270[0]._M_allocated_capacity + 1);
                  }
                  bVar32 = true;
                  if (imageType == VK_IMAGE_TYPE_3D) {
                    bVar32 = false;
                    if ((properties.maxExtent.width != 0) &&
                       (bVar32 = false, properties.maxExtent.height != 0)) {
                      bVar32 = properties.maxExtent.depth != 0;
                    }
                  }
                  local_280._0_8_ = local_280 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_280,"Invalid dimensions for 3D image","");
                  tcu::ResultCollector::check(&results,bVar32,(string *)local_280);
                  if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
                    operator_delete((void *)local_280._0_8_,local_270[0]._M_allocated_capacity + 1);
                  }
                  dVar4 = properties.maxArrayLayers;
                  local_280._0_8_ = local_280 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_280,"Invalid maxArrayLayers for 3D image","");
                  tcu::ResultCollector::check
                            (&results,dVar4 == 1 || imageType != VK_IMAGE_TYPE_3D,
                             (string *)local_280);
                  if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
                    operator_delete((void *)local_280._0_8_,local_270[0]._M_allocated_capacity + 1);
                  }
                  VVar5 = properties.sampleCounts;
                  if (tiling == VK_IMAGE_TILING_OPTIMAL) {
                    if (((uVar24 & 0x10) == 0 && imageType == VK_IMAGE_TYPE_2D) &&
                       (((uVar26 & 0x280) != 0 ||
                        (((uVar26 & 2) != 0 && (pVVar14->shaderStorageImageMultisample != 0)))))) {
                      bVar32 = ::vk::isCompressedFormat(format);
                      uVar29 = 1;
                      if (!bVar32) {
                        TVar21 = ::vk::mapVkFormat(format);
                        CVar3 = TVar21.order;
                        uVar29 = CVar3 - CHANNELORDER_LAST;
                        uVar10 = -(uint)((uVar8 & 8) == 0) |
                                 (pVVar15->limits).storageImageSampleCounts;
                        if ((uVar8 & 4) != 0) {
                          if ((CVar3 == DS) || (CVar3 == D)) {
                            uVar10 = uVar10 & (pVVar15->limits).sampledImageDepthSampleCounts;
                          }
                          uVar11 = 0xffffffff;
                          if (0xfffffffd < uVar29) {
                            uVar11 = (pVVar15->limits).sampledImageStencilSampleCounts;
                          }
                          uVar10 = uVar10 & uVar11;
                          if (uVar29 < 0xfffffffd) {
                            TVar12 = tcu::getTextureChannelClass(TVar21.type);
                            uVar10 = uVar10 & (uint)(pVVar15->limits).pointSizeRange
                                                    [(ulong)((TVar12 & ~
                                                  TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) ==
                                                  TEXTURECHANNELCLASS_SIGNED_INTEGER) - 0xc];
                          }
                        }
                        uVar10 = (-(uint)((uVar8 & 0x10) == 0) |
                                 (pVVar15->limits).framebufferColorSampleCounts) & uVar10;
                        if ((uVar8 & 0x20) != 0) {
                          if ((CVar3 == DS) || (CVar3 == D)) {
                            uVar10 = uVar10 & (pVVar15->limits).framebufferDepthSampleCounts;
                          }
                          if (0xfffffffd < uVar29) {
                            uVar10 = uVar10 & (pVVar15->limits).framebufferStencilSampleCounts;
                          }
                        }
                        uVar29 = 1;
                        if (uVar10 != 0xffffffff) {
                          uVar29 = uVar10;
                        }
                      }
                      VVar5 = properties.sampleCounts;
                      local_280._0_8_ = local_280 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_280,"Required sample counts not supported","");
                      tcu::ResultCollector::check
                                (&results,(uVar29 & ~VVar5) == 0,(string *)local_280);
                      goto LAB_0044a14a;
                    }
                    if (properties.sampleCounts != 1) {
                      local_280._0_8_ = local_280 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_280,
                                 "Implementation supports more sample counts than allowed by the spec"
                                 ,"");
                      tcu::ResultCollector::addResult
                                (&results,QP_TEST_RESULT_COMPATIBILITY_WARNING,(string *)local_280);
                      goto LAB_0044a14a;
                    }
                  }
                  else {
                    local_280._0_8_ = local_280 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_280,"sampleCounts != VK_SAMPLE_COUNT_1_BIT","");
                    tcu::ResultCollector::check(&results,VVar5 == 1,(string *)local_280);
LAB_0044a14a:
                    if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
                      operator_delete((void *)local_280._0_8_,local_270[0]._M_allocated_capacity + 1
                                     );
                    }
                  }
                  if (bVar31) {
                    dVar4 = properties.maxExtent.width;
                    uVar29 = (pVVar15->limits).maxImageDimension1D;
                    local_280._0_8_ = local_280 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_280,"Reported dimensions smaller than device limits",
                               "");
                    tcu::ResultCollector::check
                              (&results,uVar29 <= dVar4 || imageType != VK_IMAGE_TYPE_1D,
                               (string *)local_280);
                    if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
                      operator_delete((void *)local_280._0_8_,local_270[0]._M_allocated_capacity + 1
                                     );
                    }
                    bVar31 = true;
                    if (imageType == VK_IMAGE_TYPE_2D) {
                      uVar29 = (pVVar15->limits).maxImageDimension2D;
                      if (properties.maxExtent.width < uVar29) {
                        bVar31 = false;
                      }
                      else {
                        bVar31 = uVar29 <= properties.maxExtent.height;
                      }
                    }
                    local_280._0_8_ = local_280 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_280,"Reported dimensions smaller than device limits",
                               "");
                    tcu::ResultCollector::check(&results,bVar31,(string *)local_280);
                    if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
                      operator_delete((void *)local_280._0_8_,local_270[0]._M_allocated_capacity + 1
                                     );
                    }
                    bVar31 = true;
                    if (imageType == VK_IMAGE_TYPE_3D) {
                      uVar29 = (pVVar15->limits).maxImageDimension3D;
                      bVar31 = false;
                      if ((uVar29 <= properties.maxExtent.width) &&
                         (bVar31 = false, uVar29 <= properties.maxExtent.height)) {
                        bVar31 = uVar29 <= properties.maxExtent.depth;
                      }
                    }
                    local_280._0_8_ = local_280 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_280,"Reported dimensions smaller than device limits",
                               "");
                    tcu::ResultCollector::check(&results,bVar31,(string *)local_280);
                    if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
                      operator_delete((void *)local_280._0_8_,local_270[0]._M_allocated_capacity + 1
                                     );
                    }
                    dVar4 = properties.maxMipLevels;
                    local_280._0_8_ = local_280 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_280,"maxMipLevels is not full mip pyramid size","");
                    tcu::ResultCollector::check(&results,dVar4 == iVar25 + 1U,(string *)local_280);
                    if ((TestLog *)local_280._0_8_ != (TestLog *)(local_280 + 0x10)) {
                      operator_delete((void *)local_280._0_8_,local_270[0]._M_allocated_capacity + 1
                                     );
                    }
                    dVar4 = properties.maxArrayLayers;
                    uVar29 = (pVVar15->limits).maxImageArrayLayers;
                    local_280._0_8_ = (TestLog *)(local_280 + 0x10);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_280,"maxArrayLayers smaller than device limits","");
                    tcu::ResultCollector::check
                              (&results,uVar29 <= dVar4 || imageType == VK_IMAGE_TYPE_3D,
                               (string *)local_280);
                  }
                  else {
                    dVar4 = properties.maxMipLevels;
                    local_280._0_8_ = local_280 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_280,"Invalid mip pyramid size","");
                    tcu::ResultCollector::check
                              (&results,dVar4 == iVar25 + 1U || dVar4 == 1,(string *)local_280);
                    if ((TestLog *)local_280._0_8_ != (TestLog *)(local_280 + 0x10)) {
                      operator_delete((void *)local_280._0_8_,local_270[0]._M_allocated_capacity + 1
                                     );
                    }
                    dVar4 = properties.maxArrayLayers;
                    local_280._0_8_ = (TestLog *)(local_280 + 0x10);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_280,"Invalid maxArrayLayers","");
                    tcu::ResultCollector::check(&results,dVar4 != 0,(string *)local_280);
                  }
                  if ((TestLog *)local_280._0_8_ != (TestLog *)(local_280 + 0x10)) {
                    operator_delete((void *)local_280._0_8_,local_270[0]._M_allocated_capacity + 1);
                  }
                  VVar6 = properties.maxResourceSize;
                  local_280._0_8_ = (TestLog *)(local_280 + 0x10);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_280,
                             "maxResourceSize smaller than minimum required size","");
                  tcu::ResultCollector::check(&results,0x7fffffff < VVar6,(string *)local_280);
                  goto LAB_0044a71e;
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_280);
                local_68.m_value = (deUint64)::vk::getResultName;
                local_68.m_begin._0_4_ = iVar9;
                tcu::Format::Enum<vk::VkResult,_4UL>::toStream
                          ((Enum<vk::VkResult,_4UL> *)&local_68,(ostream *)local_280);
                std::__cxx11::stringbuf::str();
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_280);
                std::ios_base::~ios_base(local_210);
                plVar20 = (long *)std::__cxx11::string::replace
                                            ((ulong)&local_98,0,(char *)0x0,0xb01d6d);
                local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
                paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(plVar20 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar20 == paVar22) {
                  local_2a8.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
                  local_2a8.field_2._8_8_ = plVar20[3];
                }
                else {
                  local_2a8.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
                  local_2a8._M_dataplus._M_p = (pointer)*plVar20;
                }
                local_2a8._M_string_length = plVar20[1];
                *plVar20 = (long)paVar22;
                plVar20[1] = 0;
                *(undefined1 *)(plVar20 + 2) = 0;
                tcu::ResultCollector::fail(&results,&local_2a8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
                  operator_delete(local_2a8._M_dataplus._M_p,
                                  local_2a8.field_2._M_allocated_capacity + 1);
                }
                uVar27 = local_98.m_end;
                pTVar28 = (TestLog *)local_98.m_value;
                if ((BitDesc **)local_98.m_value == &local_98.m_end) goto LAB_0044a73f;
              }
              operator_delete(pTVar28,(ulong)((long)&((BitDesc *)uVar27)->bit + 1));
            }
LAB_0044a73f:
            uVar24 = (ulong)(uVar23 + 1);
          } while (local_f8 != uVar23 + 1);
        }
      }
      else if ((uVar8 & 0x7fffff0f) == 0 && (uVar8 & 0x30) != 0) goto LAB_00449765;
    }
    bVar31 = uVar8 == (uint)local_70;
    uVar8 = uVar8 + 1;
    if (bVar31) {
      qVar13 = tcu::ResultCollector::getResult(&results);
      local_280._0_8_ = local_280 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_280,results.m_message._M_dataplus._M_p,
                 results.m_message._M_dataplus._M_p + results.m_message._M_string_length);
      pTVar7 = local_78;
      local_78->m_code = qVar13;
      (local_78->m_description)._M_dataplus._M_p = (pointer)&(local_78->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78->m_description,local_280._0_8_,
                 (pointer)(local_280._0_8_ + local_280._8_8_));
      if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
        operator_delete((void *)local_280._0_8_,local_270[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)results.m_message._M_dataplus._M_p != &results.m_message.field_2) {
        operator_delete(results.m_message._M_dataplus._M_p,
                        results.m_message.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)results.m_prefix._M_dataplus._M_p != &results.m_prefix.field_2) {
        operator_delete(results.m_prefix._M_dataplus._M_p,
                        results.m_prefix.field_2._M_allocated_capacity + 1);
      }
      return pTVar7;
    }
  } while( true );
}

Assistant:

tcu::TestStatus imageFormatProperties (Context& context, const VkFormat format, const VkImageType imageType, const VkImageTiling tiling)
{
	TestLog&						log					= context.getTestContext().getLog();
	const VkPhysicalDeviceFeatures&	deviceFeatures		= context.getDeviceFeatures();
	const VkPhysicalDeviceLimits&	deviceLimits		= context.getDeviceProperties().limits;
	const VkFormatProperties		formatProperties	= getPhysicalDeviceFormatProperties(context.getInstanceInterface(), context.getPhysicalDevice(), format);
	const bool						hasKhrMaintenance1	= isExtensionSupported(context.getDeviceExtensions(), "VK_KHR_maintenance1");

	const VkFormatFeatureFlags		supportedFeatures	= tiling == VK_IMAGE_TILING_LINEAR ? formatProperties.linearTilingFeatures : formatProperties.optimalTilingFeatures;
	const VkImageUsageFlags			usageFlagSet		= getValidImageUsageFlags(supportedFeatures, hasKhrMaintenance1);

	tcu::ResultCollector			results				(log, "ERROR: ");

	if (hasKhrMaintenance1 && (supportedFeatures & VK_FORMAT_FEATURE_SAMPLED_IMAGE_BIT) != 0)
	{
		results.check((supportedFeatures & (VK_FORMAT_FEATURE_TRANSFER_SRC_BIT_KHR | VK_FORMAT_FEATURE_TRANSFER_DST_BIT_KHR)) != 0,
					  "A sampled image format must have VK_FORMAT_FEATURE_TRANSFER_SRC_BIT_KHR and VK_FORMAT_FEATURE_TRANSFER_DST_BIT_KHR format feature flags set");
	}

	for (VkImageUsageFlags curUsageFlags = 0; curUsageFlags <= usageFlagSet; curUsageFlags++)
	{
		if ((curUsageFlags & ~usageFlagSet) != 0 ||
			!isValidImageUsageFlagCombination(curUsageFlags))
			continue;

		const VkImageCreateFlags	createFlagSet		= getValidImageCreateFlags(deviceFeatures, format, supportedFeatures, imageType, curUsageFlags);

		for (VkImageCreateFlags curCreateFlags = 0; curCreateFlags <= createFlagSet; curCreateFlags++)
		{
			if ((curCreateFlags & ~createFlagSet) != 0 ||
				!isValidImageCreateFlagCombination(curCreateFlags))
				continue;

			const bool				isRequiredCombination	= isRequiredImageParameterCombination(deviceFeatures,
																								  format,
																								  formatProperties,
																								  imageType,
																								  tiling,
																								  curUsageFlags,
																								  curCreateFlags);
			VkImageFormatProperties	properties;
			VkResult				queryResult;

			log << TestLog::Message << "Testing " << getImageTypeStr(imageType) << ", "
									<< getImageTilingStr(tiling) << ", "
									<< getImageUsageFlagsStr(curUsageFlags) << ", "
									<< getImageCreateFlagsStr(curCreateFlags)
				<< TestLog::EndMessage;

			// Set return value to known garbage
			deMemset(&properties, 0xcd, sizeof(properties));

			queryResult = context.getInstanceInterface().getPhysicalDeviceImageFormatProperties(context.getPhysicalDevice(),
																								format,
																								imageType,
																								tiling,
																								curUsageFlags,
																								curCreateFlags,
																								&properties);

			if (queryResult == VK_SUCCESS)
			{
				const deUint32	fullMipPyramidSize	= de::max(de::max(deLog2Ceil32(properties.maxExtent.width),
																	  deLog2Ceil32(properties.maxExtent.height)),
															  deLog2Ceil32(properties.maxExtent.depth)) + 1;

				log << TestLog::Message << properties << "\n" << TestLog::EndMessage;

				results.check(imageType != VK_IMAGE_TYPE_1D || (properties.maxExtent.width >= 1 && properties.maxExtent.height == 1 && properties.maxExtent.depth == 1), "Invalid dimensions for 1D image");
				results.check(imageType != VK_IMAGE_TYPE_2D || (properties.maxExtent.width >= 1 && properties.maxExtent.height >= 1 && properties.maxExtent.depth == 1), "Invalid dimensions for 2D image");
				results.check(imageType != VK_IMAGE_TYPE_3D || (properties.maxExtent.width >= 1 && properties.maxExtent.height >= 1 && properties.maxExtent.depth >= 1), "Invalid dimensions for 3D image");
				results.check(imageType != VK_IMAGE_TYPE_3D || properties.maxArrayLayers == 1, "Invalid maxArrayLayers for 3D image");

				if (tiling == VK_IMAGE_TILING_OPTIMAL)
				{
					// Vulkan API specification has changed since initial Android Nougat release.
					// For NYC CTS we need to tolerate old behavior as well and issue compatibility
					// warning instead.
					//
					// See spec issues 272, 282, 302, 445 and CTS issues 369, 440.
					const bool	requiredByNewSpec	= (imageType == VK_IMAGE_TYPE_2D && !(curCreateFlags & VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT) &&
													  ((supportedFeatures & (VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT | VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT)) ||
													  ((supportedFeatures & VK_FORMAT_FEATURE_STORAGE_IMAGE_BIT) && deviceFeatures.shaderStorageImageMultisample)));

					if (requiredByNewSpec)
					{
						const VkSampleCountFlags	requiredSampleCounts	= getRequiredOptimalTilingSampleCounts(deviceLimits, format, curUsageFlags);

						results.check((properties.sampleCounts & requiredSampleCounts) == requiredSampleCounts, "Required sample counts not supported");
					}
					else if (properties.sampleCounts != VK_SAMPLE_COUNT_1_BIT)
					{
						results.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING,
									      "Implementation supports more sample counts than allowed by the spec");
					}
				}
				else
					results.check(properties.sampleCounts == VK_SAMPLE_COUNT_1_BIT, "sampleCounts != VK_SAMPLE_COUNT_1_BIT");

				if (isRequiredCombination)
				{
					results.check(imageType != VK_IMAGE_TYPE_1D || (properties.maxExtent.width	>= deviceLimits.maxImageDimension1D),
								  "Reported dimensions smaller than device limits");
					results.check(imageType != VK_IMAGE_TYPE_2D || (properties.maxExtent.width	>= deviceLimits.maxImageDimension2D &&
																	properties.maxExtent.height	>= deviceLimits.maxImageDimension2D),
								  "Reported dimensions smaller than device limits");
					results.check(imageType != VK_IMAGE_TYPE_3D || (properties.maxExtent.width	>= deviceLimits.maxImageDimension3D &&
																	properties.maxExtent.height	>= deviceLimits.maxImageDimension3D &&
																	properties.maxExtent.depth	>= deviceLimits.maxImageDimension3D),
								  "Reported dimensions smaller than device limits");
					results.check(properties.maxMipLevels == fullMipPyramidSize, "maxMipLevels is not full mip pyramid size");
					results.check(imageType == VK_IMAGE_TYPE_3D || properties.maxArrayLayers >= deviceLimits.maxImageArrayLayers,
								  "maxArrayLayers smaller than device limits");
				}
				else
				{
					results.check(properties.maxMipLevels == 1 || properties.maxMipLevels == fullMipPyramidSize, "Invalid mip pyramid size");
					results.check(properties.maxArrayLayers >= 1, "Invalid maxArrayLayers");
				}

				results.check(properties.maxResourceSize >= (VkDeviceSize)MINIMUM_REQUIRED_IMAGE_RESOURCE_SIZE,
							  "maxResourceSize smaller than minimum required size");
			}
			else if (queryResult == VK_ERROR_FORMAT_NOT_SUPPORTED)
			{
				log << TestLog::Message << "Got VK_ERROR_FORMAT_NOT_SUPPORTED" << TestLog::EndMessage;

				if (isRequiredCombination)
					results.fail("VK_ERROR_FORMAT_NOT_SUPPORTED returned for required image parameter combination");

				// Specification requires that all fields are set to 0
				results.check(properties.maxExtent.width	== 0, "maxExtent.width != 0");
				results.check(properties.maxExtent.height	== 0, "maxExtent.height != 0");
				results.check(properties.maxExtent.depth	== 0, "maxExtent.depth != 0");
				results.check(properties.maxMipLevels		== 0, "maxMipLevels != 0");
				results.check(properties.maxArrayLayers		== 0, "maxArrayLayers != 0");
				results.check(properties.sampleCounts		== 0, "sampleCounts != 0");
				results.check(properties.maxResourceSize	== 0, "maxResourceSize != 0");
			}
			else
			{
				results.fail("Got unexpected error" + de::toString(queryResult));
			}
		}
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}